

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::Test::RecordProperty(char *key,int value)

{
  String *this;
  Message *in_RDI;
  Message value_message;
  char *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb8;
  Message *this_00;
  String local_38;
  Message *in_stack_ffffffffffffffe0;
  Message local_18 [2];
  Message *local_8;
  
  this_00 = local_18;
  local_8 = in_RDI;
  Message::Message(in_stack_ffffffffffffffe0);
  Message::operator<<(this_00,in_stack_ffffffffffffffb8);
  Message::GetString(local_8);
  this = (String *)internal::String::c_str(&local_38);
  RecordProperty((char *)this,in_stack_ffffffffffffffa8);
  internal::String::~String(this);
  Message::~Message((Message *)0x1edcae);
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}